

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

longlong ImGui::ScaleValueFromRatioT<long_long,long_long,double>
                   (ImGuiDataType data_type,float t,longlong v_min,longlong v_max,
                   bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  bool bVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  float fVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar14 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar15 [64];
  double __x;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined8 in_XMM5_Qa;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 in_XMM9_Qa;
  undefined1 in_register_00001484 [12];
  double local_28;
  
  auVar15._4_60_ = in_register_00001244;
  auVar15._0_4_ = logarithmic_zero_epsilon;
  auVar14._4_60_ = in_register_00001204;
  auVar14._0_4_ = t;
  if (v_max - v_min == 0) {
    return v_min;
  }
  if (!is_logarithmic) {
    if ((data_type & 0xfffffffeU) == 8) {
      auVar12._0_4_ = (float)v_min;
      auVar12._4_12_ = in_ZMM3._4_12_;
      auVar13._0_4_ = (float)(v_max - v_min);
      auVar13._4_12_ = in_ZMM3._4_12_;
      auVar12 = vfmadd213ss_fma(auVar14._0_16_,auVar13,auVar12);
      return (long)auVar12._0_4_;
    }
    if (1.0 <= t) {
      return v_max;
    }
    return v_min + (long)((double)((float)(v_max - v_min) * t) +
                         *(double *)(&DAT_0054e2c0 + (ulong)(v_max < v_min) * 8));
  }
  if (t <= 0.0) {
    return v_min;
  }
  if (1.0 <= t) {
    return v_max;
  }
  auVar4._8_4_ = 0x80000000;
  auVar4._0_8_ = 0x8000000080000000;
  auVar4._12_4_ = 0x80000000;
  auVar12 = vxorps_avx512vl(auVar15._0_16_,auVar4);
  auVar18._8_8_ = 0x7fffffffffffffff;
  auVar18._0_8_ = 0x7fffffffffffffff;
  auVar17._0_8_ = (double)v_min;
  auVar17._8_8_ = in_XMM5_Qa;
  auVar22._0_8_ = (double)logarithmic_zero_epsilon;
  auVar22._8_8_ = in_register_00001244._4_8_;
  bVar1 = v_max < v_min;
  bVar7 = v_min < 0;
  fVar8 = auVar12._0_4_;
  auVar12 = vandpd_avx(auVar17,auVar18);
  uVar2 = vcmpsd_avx512f(auVar12,auVar22,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  lVar9 = (ulong)bVar3 *
          (long)(double)(float)((uint)bVar7 * (int)fVar8 +
                               (uint)!bVar7 * (int)logarithmic_zero_epsilon) +
          (ulong)!bVar3 * (long)auVar17._0_8_;
  auVar21._0_8_ = (double)v_max;
  auVar21._8_8_ = in_XMM9_Qa;
  auVar12 = vandpd_avx(auVar21,auVar18);
  uVar2 = vcmpsd_avx512f(auVar12,auVar22,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  lVar10 = (ulong)bVar3 *
           (long)(double)(float)((uint)(v_max < 0) * (int)fVar8 +
                                (uint)(v_max >= 0) * (int)logarithmic_zero_epsilon) +
           (ulong)!bVar3 * (long)auVar21._0_8_;
  dVar11 = (double)((ulong)bVar1 * lVar10 + (ulong)!bVar1 * lVar9);
  lVar9 = (ulong)bVar1 * lVar9 + (ulong)!bVar1 * lVar10;
  local_28 = (double)((ulong)bVar7 *
                      ((ulong)(v_max == 0) * (long)(double)fVar8 + (ulong)(v_max != 0) * lVar9) +
                     (ulong)!bVar7 * lVar9);
  fVar8 = (float)((uint)bVar1 * (int)(1.0 - t) + (uint)!bVar1 * (int)t);
  if (v_max * v_min < 0) {
    fVar16 = (float)v_max;
    if (v_min < v_max) {
      v_max = v_min;
    }
    auVar19._0_4_ = (float)v_max;
    auVar19._4_12_ = in_register_00001484;
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(auVar19,auVar5);
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)(fVar16 - (float)v_min)),auVar6);
    fVar20 = auVar12._0_4_ / auVar13._0_4_;
    fVar16 = fVar20 + zero_deadzone_halfsize;
    if ((fVar20 - zero_deadzone_halfsize <= fVar8) && (fVar8 <= fVar16)) {
      return 0;
    }
    if (fVar8 < fVar20) {
      dVar11 = pow(-dVar11 / auVar22._0_8_,(double)(1.0 - fVar8 / (fVar20 - zero_deadzone_halfsize))
                  );
      dVar11 = -dVar11;
      local_28 = auVar22._0_8_;
      goto LAB_00300c6e;
    }
    __x = local_28 / auVar22._0_8_;
    fVar8 = (fVar8 - fVar16) / (1.0 - fVar16);
    local_28 = auVar22._0_8_;
  }
  else if ((v_max | v_min) < 0) {
    __x = dVar11 / local_28;
    fVar8 = 1.0 - fVar8;
  }
  else {
    __x = local_28 / dVar11;
    local_28 = dVar11;
  }
  dVar11 = pow(__x,(double)fVar8);
LAB_00300c6e:
  return (long)(dVar11 * local_28);
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}